

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::null_scoped_padder>::format
          (pid_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  char *__src;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar2;
  format_int fStack_48;
  
  uVar1 = getpid();
  __src = ::fmt::v6::format_int::format_decimal(&fStack_48,(ulong)uVar1);
  __n = (long)(fStack_48.buffer_ + 0x15) - (long)__src;
  uVar2 = (dest->super_buffer<char>).size_ + __n;
  fStack_48.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar2) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar2);
  }
  if (fStack_48.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar2;
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = fmt_helper::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }